

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O0

int stbtt_FindMatchingFont(uchar *font_collection,char *name_utf8,stbtt_int32 flags)

{
  stbtt_uint32 offset;
  int iVar1;
  int local_28;
  stbtt_int32 off;
  stbtt_int32 i;
  stbtt_int32 flags_local;
  char *name_utf8_local;
  uchar *font_collection_local;
  
  local_28 = 0;
  while ((offset = stbtt_GetFontOffsetForIndex(font_collection,local_28), -1 < (int)offset &&
         (iVar1 = stbtt__matches(font_collection,offset,(stbtt_uint8 *)name_utf8,flags), iVar1 == 0)
         )) {
    local_28 = local_28 + 1;
  }
  return offset;
}

Assistant:

STBTT_DEF int stbtt_FindMatchingFont(const unsigned char *font_collection, const char *name_utf8, stbtt_int32 flags)
{
   stbtt_int32 i;
   for (i=0;;++i) {
      stbtt_int32 off = stbtt_GetFontOffsetForIndex(font_collection, i);
      if (off < 0) return off;
      if (stbtt__matches((stbtt_uint8 *) font_collection, off, (stbtt_uint8*) name_utf8, flags))
         return off;
   }
}